

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void decrease_morale(tgestate_t *state,uint8_t delta)

{
  int decreased_morale;
  uint8_t delta_local;
  tgestate_t *state_local;
  
  decreased_morale = (uint)state->morale - (uint)delta;
  if (decreased_morale < 0) {
    decreased_morale = 0;
  }
  state->morale = (uint8_t)decreased_morale;
  return;
}

Assistant:

void decrease_morale(tgestate_t *state, uint8_t delta)
{
  int decreased_morale;

  assert(state != NULL);
  assert(delta > 0);

  decreased_morale = state->morale - delta;
  if (decreased_morale < morale_MIN)
    decreased_morale = morale_MIN;

  assert(decreased_morale >= morale_MIN);
  assert(decreased_morale <= morale_MAX);

  /* Conv: This jumps into the tail end of increase_morale in the original
   * code. */
  state->morale = decreased_morale;
}